

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void scm_space_rake(void)

{
  cell_map local_50;
  
  scm_stop();
  if (width < 0x1a) {
    width = 0x1a;
  }
  if (height < 0x17) {
    height = 0x17;
  }
  cell_map::cell_map(&local_50,width,height);
  cell_map::operator=(&grid,&local_50);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_50.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  cell_map::set_cell(&grid,2,0x11);
  cell_map::set_cell(&grid,2,0x13);
  cell_map::set_cell(&grid,3,0x14);
  cell_map::set_cell(&grid,4,0x14);
  cell_map::set_cell(&grid,5,0x11);
  cell_map::set_cell(&grid,5,0x14);
  cell_map::set_cell(&grid,6,0x12);
  cell_map::set_cell(&grid,6,0x13);
  cell_map::set_cell(&grid,6,0x14);
  cell_map::set_cell(&grid,0x13,0x13);
  cell_map::set_cell(&grid,0x13,0x11);
  cell_map::set_cell(&grid,0x14,0x10);
  cell_map::set_cell(&grid,0x15,0x10);
  cell_map::set_cell(&grid,0x16,0x13);
  cell_map::set_cell(&grid,0x16,0x10);
  cell_map::set_cell(&grid,0x17,0x10);
  cell_map::set_cell(&grid,0x17,0x11);
  cell_map::set_cell(&grid,0x17,0x12);
  cell_map::set_cell(&grid,0x13,5);
  cell_map::set_cell(&grid,0x13,3);
  cell_map::set_cell(&grid,0x14,2);
  cell_map::set_cell(&grid,0x15,2);
  cell_map::set_cell(&grid,0x16,5);
  cell_map::set_cell(&grid,0x16,2);
  cell_map::set_cell(&grid,0x17,2);
  cell_map::set_cell(&grid,0x17,3);
  cell_map::set_cell(&grid,0x17,4);
  cell_map::set_cell(&grid,8,9);
  cell_map::set_cell(&grid,9,8);
  cell_map::set_cell(&grid,9,10);
  cell_map::set_cell(&grid,10,7);
  cell_map::set_cell(&grid,10,8);
  cell_map::set_cell(&grid,10,10);
  cell_map::set_cell(&grid,10,0xb);
  cell_map::set_cell(&grid,0xb,10);
  cell_map::set_cell(&grid,0xb,0xb);
  cell_map::set_cell(&grid,0xc,10);
  cell_map::set_cell(&grid,0xc,0xb);
  cell_map::set_cell(&grid,0xd,10);
  cell_map::set_cell(&grid,0xd,0xb);
  cell_map::set_cell(&grid,0xd,0xc);
  cell_map::set_cell(&grid,0xb,3);
  cell_map::set_cell(&grid,0xb,4);
  cell_map::set_cell(&grid,0xc,3);
  cell_map::set_cell(&grid,0xc,4);
  cell_map::set_cell(&grid,0xc,5);
  cell_map::set_cell(&grid,0xd,2);
  cell_map::set_cell(&grid,0xd,4);
  cell_map::set_cell(&grid,0xd,5);
  cell_map::set_cell(&grid,0xe,2);
  cell_map::set_cell(&grid,0xe,3);
  cell_map::set_cell(&grid,0xe,4);
  cell_map::set_cell(&grid,0xf,3);
  cell_map::set_cell(&grid,0x11,0xb);
  cell_map::set_cell(&grid,0x12,9);
  cell_map::set_cell(&grid,0x12,10);
  cell_map::set_cell(&grid,0x12,0xb);
  cell_map::set_cell(&grid,0x12,0xc);
  cell_map::set_cell(&grid,0x13,8);
  cell_map::set_cell(&grid,0x13,0xc);
  cell_map::set_cell(&grid,0x14,8);
  cell_map::set_cell(&grid,0x14,0xb);
  cell_map::set_cell(&grid,0x15,9);
  cell_map::set_cell(&grid,0x15,10);
  cell_map::set_cell(&grid,0x15,0xb);
  paint_grid();
  return;
}

Assistant:

void scm_space_rake()
  {
  scm_stop();
  if (width < 26)
    width = 26;
  if (height < 23)
    height = 23;
  grid = cell_map(width, height);

  grid.set_cell(2, 17);
  grid.set_cell(2, 19);
  grid.set_cell(3, 20);
  grid.set_cell(4, 20);
  grid.set_cell(5, 17);
  grid.set_cell(5, 20);
  grid.set_cell(6, 18);
  grid.set_cell(6, 19);
  grid.set_cell(6, 20);


  grid.set_cell(19, 19);
  grid.set_cell(19, 17);
  grid.set_cell(20, 16);
  grid.set_cell(21, 16);
  grid.set_cell(22, 19);
  grid.set_cell(22, 16);
  grid.set_cell(23, 16);
  grid.set_cell(23, 17);
  grid.set_cell(23, 18);  

  grid.set_cell(19, 5);
  grid.set_cell(19, 3);
  grid.set_cell(20, 2);
  grid.set_cell(21, 2);
  grid.set_cell(22, 5);
  grid.set_cell(22, 2);
  grid.set_cell(23, 2);
  grid.set_cell(23, 3);
  grid.set_cell(23, 4);

  grid.set_cell(8, 9);
  grid.set_cell(9, 8);
  grid.set_cell(9, 10);
  grid.set_cell(10, 7);
  grid.set_cell(10, 8);
  grid.set_cell(10, 10);
  grid.set_cell(10, 11);
  grid.set_cell(11, 10);
  grid.set_cell(11, 11);
  grid.set_cell(12, 10);
  grid.set_cell(12, 11);
  grid.set_cell(13, 10);
  grid.set_cell(13, 11);
  grid.set_cell(13, 12);

  grid.set_cell(11, 3);
  grid.set_cell(11, 4);
  grid.set_cell(12, 3);
  grid.set_cell(12, 4);
  grid.set_cell(12, 5);
  grid.set_cell(13, 2);
  grid.set_cell(13, 4);
  grid.set_cell(13, 5);
  grid.set_cell(14, 2);
  grid.set_cell(14, 3);
  grid.set_cell(14, 4);
  grid.set_cell(15, 3);

  grid.set_cell(17, 11);
  grid.set_cell(18, 9);
  grid.set_cell(18, 10);
  grid.set_cell(18, 11);
  grid.set_cell(18, 12);
  grid.set_cell(19, 8);
  grid.set_cell(19, 12);
  grid.set_cell(20, 8);
  grid.set_cell(20, 11);
  grid.set_cell(21, 9);
  grid.set_cell(21, 10);
  grid.set_cell(21, 11);

  paint_grid();
  }